

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
          (void *param_1,byte_string_storage *param_2)

{
  array_storage *other;
  byte_string_storage *this;
  array_storage temp;
  byte_string_storage *args;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  array_storage local_28;
  byte_string_storage *local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  other = cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage>
                    (in_stack_ffffffffffffffc0);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::array_storage::array_storage
            (&local_28,other);
  args = local_18;
  this = cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage>
                   (in_stack_ffffffffffffffc0);
  construct<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::byte_string_storage&>
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,args);
  construct<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::array_storage&>
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
             (array_storage *)args);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }